

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::Pooling3DLayerParams::ByteSizeLong(Pooling3DLayerParams *this)

{
  bool bVar1;
  Pooling3DLayerParams_PoolingType3D PVar2;
  int32 iVar3;
  Pooling3DLayerParams_Pooling3DPaddingType PVar4;
  int iVar5;
  size_t sVar6;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  Pooling3DLayerParams *this_local;
  
  sStack_18 = 0;
  PVar2 = type(this);
  if (PVar2 != Pooling3DLayerParams_PoolingType3D_MAX) {
    PVar2 = type(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::EnumSize(PVar2);
    sStack_18 = sStack_18 + 1;
  }
  iVar3 = kerneldepth(this);
  if (iVar3 != 0) {
    iVar3 = kerneldepth(this);
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  iVar3 = kernelheight(this);
  if (iVar3 != 0) {
    iVar3 = kernelheight(this);
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  iVar3 = kernelwidth(this);
  if (iVar3 != 0) {
    iVar3 = kernelwidth(this);
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  iVar3 = stridedepth(this);
  if (iVar3 != 0) {
    iVar3 = stridedepth(this);
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  iVar3 = strideheight(this);
  if (iVar3 != 0) {
    iVar3 = strideheight(this);
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  iVar3 = stridewidth(this);
  if (iVar3 != 0) {
    iVar3 = stridewidth(this);
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  iVar3 = custompaddingfront(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingfront(this);
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  iVar3 = custompaddingback(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingback(this);
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  iVar3 = custompaddingtop(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingtop(this);
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  iVar3 = custompaddingbottom(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingbottom(this);
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  iVar3 = custompaddingleft(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingleft(this);
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  iVar3 = custompaddingright(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingright(this);
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  bVar1 = countexcludepadding(this);
  if (bVar1) {
    sStack_18 = sStack_18 + 2;
  }
  PVar4 = paddingtype(this);
  if (PVar4 != Pooling3DLayerParams_Pooling3DPaddingType_CUSTOM) {
    PVar4 = paddingtype(this);
    sVar6 = google::protobuf::internal::WireFormatLite::EnumSize(PVar4);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  iVar5 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar5;
  return sStack_18;
}

Assistant:

size_t Pooling3DLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Pooling3DLayerParams)
  size_t total_size = 0;

  // .CoreML.Specification.Pooling3DLayerParams.PoolingType3D type = 1;
  if (this->type() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->type());
  }

  // int32 kernelDepth = 2;
  if (this->kerneldepth() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->kerneldepth());
  }

  // int32 kernelHeight = 3;
  if (this->kernelheight() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->kernelheight());
  }

  // int32 kernelWidth = 4;
  if (this->kernelwidth() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->kernelwidth());
  }

  // int32 strideDepth = 5;
  if (this->stridedepth() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->stridedepth());
  }

  // int32 strideHeight = 6;
  if (this->strideheight() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->strideheight());
  }

  // int32 strideWidth = 7;
  if (this->stridewidth() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->stridewidth());
  }

  // int32 customPaddingFront = 8;
  if (this->custompaddingfront() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingfront());
  }

  // int32 customPaddingBack = 9;
  if (this->custompaddingback() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingback());
  }

  // int32 customPaddingTop = 10;
  if (this->custompaddingtop() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingtop());
  }

  // int32 customPaddingBottom = 11;
  if (this->custompaddingbottom() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingbottom());
  }

  // int32 customPaddingLeft = 12;
  if (this->custompaddingleft() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingleft());
  }

  // int32 customPaddingRight = 13;
  if (this->custompaddingright() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingright());
  }

  // bool countExcludePadding = 14;
  if (this->countexcludepadding() != 0) {
    total_size += 1 + 1;
  }

  // .CoreML.Specification.Pooling3DLayerParams.Pooling3DPaddingType paddingType = 15;
  if (this->paddingtype() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->paddingtype());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}